

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  size_type sVar1;
  byte c;
  long lVar2;
  _Alloc_hider _Var3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_class_1_0_00000001 to_hex_string;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  __string_type local_40;
  
  c = (byte)this;
  lVar2 = 8;
  do {
    if (*(byte *)((long)&PTR_typeinfo_name_00245228 + lVar2) == c) {
      std::__cxx11::string::string
                ((string *)&local_80,*(char **)(&DAT_00245230 + lVar2),(allocator *)&local_40);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_80 == &local_70) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_78;
      return __return_storage_ptr__;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x58);
  if (c < 0x20) {
    transformed[abi:cxx11](char)::{lambda(char)#2}::operator()[abi_cxx11_(&local_40,&local_60,c);
    paVar5 = &local_40.field_2;
    _Var3._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == paVar5) {
      local_70._8_8_ = local_40.field_2._8_8_;
      _Var3._M_p = (pointer)&local_70;
    }
    local_70._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    psVar4 = &local_40._M_string_length;
  }
  else {
    paVar5 = &local_50;
    local_60 = paVar5;
    std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
    _Var3._M_p = (pointer)local_60;
    if (local_60 == paVar5) {
      local_70._8_8_ = local_50._8_8_;
      _Var3._M_p = (pointer)&local_70;
    }
    local_70._M_allocated_capacity = local_50._M_allocated_capacity;
    psVar4 = &local_58;
  }
  sVar1 = *psVar4;
  (((__string_type *)(psVar4 + -1))->_M_dataplus)._M_p = (pointer)paVar5;
  *psVar4 = 0;
  paVar5->_M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_80 = &local_70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p == local_80) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = _Var3._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_70._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_78 = 0;
  local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
  if (c < 0x20) {
    local_50._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)local_60;
    if (local_60 == &local_50) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_50._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( auto tr : table )
    {
        if ( chr == tr.chr )
            return tr.str;
    }

    // The cast below helps suppress warnings ("-Wtype-limits" on GCC) on architectures where `char` is unsigned.
    auto unprintable = [](char c){ return 0 <= static_cast<signed char>(c) && c < ' '; };

    auto to_hex_string = [](char c)
    {
        std::ostringstream os;
        os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
        return os.str();
    };

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}